

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundPositivePrecisionFunction<long,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  long lVar2;
  ulong count;
  long *plVar3;
  long *plVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  const_reference this_00;
  pointer pEVar14;
  reference vector;
  long lVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  unsigned_long uVar20;
  ulong uVar21;
  idx_t idx_in_entry;
  ulong uVar22;
  long lVar23;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  long local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar12->bind_info);
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar12->children,0);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  bVar11 = DecimalType::GetScale(&pEVar14->return_type);
  lVar2 = *(long *)(NumericHelper::POWERS_OF_TEN +
                   ((ulong)bVar11 - (long)*(int *)&pFVar13[1]._vptr_FunctionData) * 8);
  lVar23 = lVar2 / 2;
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    pdVar6 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      if (count != 0) {
        uVar22 = 0;
        do {
          lVar18 = lVar23;
          if (*(long *)(pdVar6 + uVar22 * 8) < 0) {
            lVar18 = -lVar23;
          }
          *(long *)(pdVar7 + uVar22 * 8) = (lVar18 + *(long *)(pdVar6 + uVar22 * 8)) / lVar2;
          uVar22 = uVar22 + 1;
        } while (count != uVar22);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar19 = 0;
        uVar22 = 0;
        do {
          if (puVar5 == (unsigned_long *)0x0) {
            uVar20 = 0xffffffffffffffff;
          }
          else {
            uVar20 = puVar5[uVar19];
          }
          uVar21 = uVar22 + 0x40;
          if (count <= uVar22 + 0x40) {
            uVar21 = count;
          }
          uVar17 = uVar21;
          if (uVar20 != 0) {
            uVar17 = uVar22;
            if (uVar20 == 0xffffffffffffffff) {
              if (uVar22 < uVar21) {
                do {
                  lVar18 = lVar23;
                  if (*(long *)(pdVar6 + uVar22 * 8) < 0) {
                    lVar18 = -lVar23;
                  }
                  *(long *)(pdVar7 + uVar22 * 8) = (lVar18 + *(long *)(pdVar6 + uVar22 * 8)) / lVar2
                  ;
                  uVar22 = uVar22 + 1;
                  uVar17 = uVar22;
                } while (uVar21 != uVar22);
              }
            }
            else if (uVar22 < uVar21) {
              uVar17 = 0;
              do {
                if ((uVar20 >> (uVar17 & 0x3f) & 1) != 0) {
                  lVar18 = lVar23;
                  if (*(long *)(pdVar6 + uVar17 * 8 + uVar22 * 8) < 0) {
                    lVar18 = -lVar23;
                  }
                  *(long *)(pdVar7 + uVar17 * 8 + uVar22 * 8) =
                       (lVar18 + *(long *)(pdVar6 + uVar17 * 8 + uVar22 * 8)) / lVar2;
                }
                uVar17 = uVar17 + 1;
              } while ((uVar22 - uVar21) + uVar17 != 0);
              uVar17 = uVar22 + uVar17;
            }
          }
          uVar19 = uVar19 + 1;
          uVar22 = uVar17;
        } while (uVar19 != count + 0x3f >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    plVar3 = (long *)result->data;
    plVar4 = (long *)vector->data;
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    lVar18 = -lVar23;
    if (-1 < *plVar4) {
      lVar18 = lVar23;
    }
    *plVar3 = (lVar18 + *plVar4) / lVar2;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar8 = (local_78.sel)->sel_vector;
        uVar22 = 0;
        do {
          uVar19 = uVar22;
          if (psVar8 != (sel_t *)0x0) {
            uVar19 = (ulong)psVar8[uVar22];
          }
          lVar18 = lVar23;
          if (*(long *)(local_78.data + uVar19 * 8) < 0) {
            lVar18 = -lVar23;
          }
          *(long *)(pdVar7 + uVar22 * 8) = (lVar18 + *(long *)(local_78.data + uVar19 * 8)) / lVar2;
          uVar22 = uVar22 + 1;
        } while (count != uVar22);
      }
    }
    else if (count != 0) {
      psVar8 = (local_78.sel)->sel_vector;
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      lVar18 = -lVar23;
      uVar22 = 0;
      local_90 = lVar18;
      do {
        uVar19 = uVar22;
        if (psVar8 != (sel_t *)0x0) {
          uVar19 = (ulong)psVar8[uVar22];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar19 >> 6]
             >> (uVar19 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var10 = p_Stack_a0;
            peVar9 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            lVar18 = local_90;
          }
          bVar11 = (byte)uVar22 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar22 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        else {
          lVar15 = lVar23;
          if (*(long *)(local_78.data + uVar19 * 8) < 0) {
            lVar15 = lVar18;
          }
          *(long *)(pdVar7 + uVar22 * 8) = (lVar15 + *(long *)(local_78.data + uVar19 * 8)) / lVar2;
        }
        uVar22 = uVar22 + 1;
      } while (count != uVar22);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}